

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::validate(Datetime *this)

{
  uint month;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = this->_year;
  if (iVar4 == 0 || 0xffffe05b < iVar4 - 10000U) {
    month = this->_month;
    if (0xc < month) {
      return false;
    }
    if (0x35 < (uint)this->_week) {
      return false;
    }
    if ((this->_weekday <= (int)((weekstart == 1) + 6) &&
         (int)(uint)(weekstart == 1) <= this->_weekday) &&
       ((uVar1 = this->_julian, uVar1 == 0 ||
        ((0 < (int)uVar1 && (uVar3 = daysInYear(iVar4), uVar1 <= uVar3)))))) {
      iVar2 = this->_day;
      if (iVar2 == 0) {
        if ((uint)this->_seconds < 0x15181) goto LAB_00108040;
      }
      else if (0 < iVar2) {
        iVar4 = daysInMonth(iVar4,month);
        if (iVar4 < iVar2) {
          return false;
        }
        if (0x15180 < (uint)this->_seconds) {
          return false;
        }
LAB_00108040:
        return this->_offset + 0x15180U < 0x2a301;
      }
    }
  }
  return false;
}

Assistant:

bool Datetime::validate ()
{
  // for ISO 8601 week specification: YYYY-Www-D where D is 1-7 (Mon-Sun)
  int wks = (Datetime::weekstart == 1 ? 1: 0);
  int wke = (Datetime::weekstart == 1 ? 7: 6);

  // _year;
  if ((_year    && (_year    <   1900 || _year    >                                  9999)) ||
      (_month   && (_month   <      1 || _month   >                                    12)) ||
      (_week    && (_week    <      1 || _week    >                                    53)) ||
      (true     && (_weekday <    wks || _weekday >                                   wke)) ||
      (_julian  && (_julian  <      1 || _julian  >          Datetime::daysInYear (_year))) ||
      (_day     && (_day     <      1 || _day     > Datetime::daysInMonth (_year, _month))) ||
      (_seconds && (_seconds <      1 || _seconds >                                 86400)) ||
      (_offset  && (_offset  < -86400 || _offset  >                                 86400)))
    return false;

  return true;
}